

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall tcu::Matrix<float,_2,_4>::Matrix(Matrix<float,_2,_4> *this,float *src)

{
  int row;
  long lVar1;
  int col;
  long lVar2;
  
  Vector<tcu::Vector<float,_2>,_4>::Vector(&this->m_data);
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      *(float *)((long)this + lVar2 * 2 * 4) = src[lVar2];
    }
    src = src + 4;
    this = (Matrix<float,_2,_4> *)((long)this + 4);
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const T src[Rows*Cols])
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src[row*Cols + col];
}